

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_vector_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceVertexTangentVectorQuantity::SurfaceVertexTangentVectorQuantity
          (SurfaceVertexTangentVectorQuantity *this,string *name,
          vector<glm::vec<2,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<2,_float,_(glm::qualifier)0>_>_>
          *vectors_,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *basisX_,vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
                   *basisY_,SurfaceMesh *mesh_,int nSym_,VectorType vectorType_)

{
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  *pvVar1;
  string local_50;
  
  pvVar1 = basisX_;
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  SurfaceVectorQuantity::SurfaceVectorQuantity
            (&this->super_SurfaceVectorQuantity,&local_50,mesh_,(MeshElement)pvVar1);
  std::__cxx11::string::~string((string *)&local_50);
  *(undefined ***)&this->super_SurfaceVectorQuantity =
       &PTR__SurfaceVertexTangentVectorQuantity_005975c0;
  TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>::TangentVectorQuantity
            (&this->super_TangentVectorQuantity<polyscope::SurfaceVertexTangentVectorQuantity>,this,
             vectors_,basisX_,basisY_,
             (ManagedBuffer<glm::vec<3,_float,_(glm::qualifier)0>_> *)
             (*(long *)&(this->super_SurfaceVectorQuantity).field_0x190 + 0x458),nSym_,vectorType_);
  *(undefined ***)&this->super_SurfaceVectorQuantity =
       &PTR__SurfaceVertexTangentVectorQuantity_005975c0;
  return;
}

Assistant:

SurfaceVertexTangentVectorQuantity::SurfaceVertexTangentVectorQuantity(
    std::string name, std::vector<glm::vec2> vectors_, std::vector<glm::vec3> basisX_, std::vector<glm::vec3> basisY_,
    SurfaceMesh& mesh_, int nSym_, VectorType vectorType_)
    : SurfaceVectorQuantity(name, mesh_, MeshElement::VERTEX),
      TangentVectorQuantity<SurfaceVertexTangentVectorQuantity>(*this, vectors_, basisX_, basisY_,
                                                                parent.vertexPositions, nSym_, vectorType_) {}